

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

roaring_bitmap_t * synthesized_xor(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint uVar1;
  roaring_bitmap_t *r;
  uint64_t uVar2;
  uint64_t uVar3;
  roaring_bitmap_t *r_00;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *prVar4;
  roaring_statistics_t stats;
  roaring_statistics_t local_70;
  
  roaring_bitmap_statistics(r1,&local_70);
  uVar1 = local_70.max_value;
  roaring_bitmap_statistics(r2,&local_70);
  if (uVar1 < local_70.max_value) {
    uVar1 = local_70.max_value;
  }
  r = roaring_bitmap_or(r1,r2);
  uVar2 = roaring_bitmap_get_cardinality(r);
  uVar3 = roaring_bitmap_or_cardinality(r1,r2);
  _assert_true((ulong)(uVar2 == uVar3),
               "roaring_bitmap_get_cardinality(r1_or_r2) == roaring_bitmap_or_cardinality(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x744);
  r_00 = roaring_bitmap_and(r1,r2);
  uVar2 = roaring_bitmap_get_cardinality(r_00);
  uVar3 = roaring_bitmap_and_cardinality(r1,r2);
  _assert_true((ulong)(uVar2 == uVar3),
               "roaring_bitmap_get_cardinality(r1_and_r2) == roaring_bitmap_and_cardinality(r1, r2)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x748);
  x2 = roaring_bitmap_flip(r_00,0,(ulong)(uVar1 + 1));
  prVar4 = roaring_bitmap_and(r,x2);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(x2);
  return prVar4;
}

Assistant:

static roaring_bitmap_t *synthesized_xor(roaring_bitmap_t *r1,
                                         roaring_bitmap_t *r2) {
    unsigned universe_size = 0;
    roaring_statistics_t stats;
    roaring_bitmap_statistics(r1, &stats);
    universe_size = stats.max_value;
    roaring_bitmap_statistics(r2, &stats);
    if (stats.max_value > universe_size) universe_size = stats.max_value;

    roaring_bitmap_t *r1_or_r2 = roaring_bitmap_or(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_or_r2) ==
                roaring_bitmap_or_cardinality(r1, r2));

    roaring_bitmap_t *r1_and_r2 = roaring_bitmap_and(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_and_r2) ==
                roaring_bitmap_and_cardinality(r1, r2));

    roaring_bitmap_t *r1_nand_r2 =
        roaring_bitmap_flip(r1_and_r2, 0U, universe_size + 1U);
    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_and(r1_or_r2, r1_nand_r2);
    roaring_bitmap_free(r1_or_r2);
    roaring_bitmap_free(r1_and_r2);
    roaring_bitmap_free(r1_nand_r2);
    return r1_xor_r2;
}